

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1f1d4f::SuperBlockSizeTestLarge::~SuperBlockSizeTestLarge
          (SuperBlockSizeTestLarge *this)

{
  libaom_test::EncoderTest::~EncoderTest(&this->super_EncoderTest);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~SuperBlockSizeTestLarge() override = default;